

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O2

timer_object_holder<timertt::thread_safety::unsafe> __thiscall
timertt::details::
timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::allocate(timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
           *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x48);
  *(undefined8 **)
   &(this->
    super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
    ).m_error_logger.super__Function_base._M_functor = puVar1;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  *puVar1 = &PTR__timer_type_002c6b80;
  puVar1[8] = 0;
  *(undefined4 *)(puVar1 + 1) = 1;
  return (timer_object_holder<timertt::thread_safety::unsafe>)
         (timer_object<timertt::thread_safety::unsafe> *)this;
}

Assistant:

timer_object_holder< THREAD_SAFETY >
	allocate()
	{
		return timer_object_holder< THREAD_SAFETY >( new timer_type() );
	}